

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupReplaceCut(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  int i;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  Gia_ManHighLightFlopLogic(p);
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Gia_ManFillValue(p);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  pObj._4_4_ = 0;
  while( true ) {
    bVar5 = false;
    if (pObj._4_4_ < p->nObjs) {
      pFanin = Gia_ManObj(p,pObj._4_4_);
      bVar5 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd(pFanin);
    if ((iVar1 != 0) && ((*(ulong *)pFanin >> 0x1e & 1) != 0)) {
      pGVar4 = Gia_ObjFanin0(pFanin);
      if (((*(ulong *)pGVar4 >> 0x1e & 1) == 0) && (pGVar4->Value == 0xffffffff)) {
        uVar2 = Gia_ManAppendCi(p_00);
        pGVar4->Value = uVar2;
      }
      pGVar4 = Gia_ObjFanin1(pFanin);
      if (((*(ulong *)pGVar4 >> 0x1e & 1) == 0) && (pGVar4->Value == 0xffffffff)) {
        uVar2 = Gia_ManAppendCi(p_00);
        pGVar4->Value = uVar2;
      }
    }
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  pObj._4_4_ = 0;
  while( true ) {
    iVar1 = Gia_ManRegNum(p);
    bVar5 = false;
    if (pObj._4_4_ < iVar1) {
      iVar1 = Gia_ManPiNum(p);
      pFanin = Gia_ManCi(p,iVar1 + pObj._4_4_);
      bVar5 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pFanin->Value = uVar2;
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  pObj._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar5 = false;
    if (pObj._4_4_ < iVar1) {
      pFanin = Gia_ManCo(p,pObj._4_4_);
      bVar5 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    Gia_ManDupOrderDfs_rec(p_00,p,pFanin);
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  iVar1 = Gia_ManRegNum(p);
  Gia_ManSetRegNum(p_00,iVar1);
  Gia_ManCleanMark0(p);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupReplaceCut( Gia_Man_t * p )
{
    Gia_Man_t * pNew;  int i;
    Gia_Obj_t * pObj, * pFanin;
    Gia_ManHighLightFlopLogic( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create PIs for nodes pointed to from above the cut
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !pObj->fMark0 )
            continue;
        pFanin = Gia_ObjFanin0(pObj);
        if ( !pFanin->fMark0 && !~pFanin->Value )
            pFanin->Value = Gia_ManAppendCi(pNew);
        pFanin = Gia_ObjFanin1(pObj);
        if ( !pFanin->fMark0 && !~pFanin->Value )
            pFanin->Value = Gia_ManAppendCi(pNew);
    }
    // create flop outputs
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupOrderDfs_rec( pNew, p, pObj );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManCleanMark0( p );
    return pNew;
}